

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadDynamicSection(cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  cmELF *pcVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  lVar4 = (long)(this->super_cmELFInternal).DynamicSectionIndex;
  if (-1 < lVar4) {
    if ((this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    paVar1 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (paVar1[lVar4].sh_entsize != 0) {
      uVar7 = (uint)(paVar1[lVar4].sh_size / paVar1[lVar4].sh_entsize);
      std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::resize
                (&this->DynamicSectionEntries,(long)(int)uVar7);
      if ((int)uVar7 < 1) {
        return true;
      }
      lVar6 = 0;
      uVar5 = 0;
      do {
        std::istream::seekg((this->super_cmELFInternal).Stream,
                            paVar1[lVar4].sh_entsize * uVar5 + paVar1[lVar4].sh_offset,0);
        bVar3 = Read(this,(ELF_Dyn *)
                          ((long)&((this->DynamicSectionEntries).
                                   super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl
                                   .super__Vector_impl_data._M_start)->d_tag + lVar6));
        if (!bVar3) {
          pcVar2 = (this->super_cmELFInternal).External;
          std::__cxx11::string::_M_replace
                    ((ulong)&pcVar2->ErrorMessage,0,(char *)(pcVar2->ErrorMessage)._M_string_length,
                     0x653811);
          (this->super_cmELFInternal).ELFType = FileTypeInvalid;
          (this->super_cmELFInternal).DynamicSectionIndex = -1;
          return false;
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar5 < (uVar7 & 0x7fffffff));
      return true;
    }
  }
  return false;
}

Assistant:

bool cmELFInternalImpl<Types>::LoadDynamicSection()
{
  // If there is no dynamic section we are done.
  if (this->DynamicSectionIndex < 0) {
    return false;
  }

  // If the section was already loaded we are done.
  if (!this->DynamicSectionEntries.empty()) {
    return true;
  }

  // If there are no entries we are done.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_entsize == 0) {
    return false;
  }

  // Allocate the dynamic section entries.
  int n = static_cast<int>(sec.sh_size / sec.sh_entsize);
  this->DynamicSectionEntries.resize(n);

  // Read each entry.
  for (int j = 0; j < n; ++j) {
    // Seek to the beginning of the section entry.
    this->Stream.seekg(sec.sh_offset + sec.sh_entsize * j);
    ELF_Dyn& dyn = this->DynamicSectionEntries[j];

    // Try reading the entry.
    if (!this->Read(dyn)) {
      this->SetErrorMessage("Error reading entry from DYNAMIC section.");
      this->DynamicSectionIndex = -1;
      return false;
    }
  }
  return true;
}